

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<float,_1000>::~TPZManVector(TPZManVector<float,_1000> *this)

{
  TPZManVector<float,_1000> *in_RDI;
  
  ~TPZManVector(in_RDI);
  operator_delete(in_RDI,0xfc0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}